

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall cmOrderDirectories::VisitDirectory(cmOrderDirectories *this,uint i)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  pointer ppVar4;
  reference __x;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_30;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_28;
  const_iterator j;
  ConflictList *clist;
  uint i_local;
  cmOrderDirectories *this_local;
  
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->DirectoryVisited,(ulong)i);
  if (*pvVar3 == 0) {
    vVar1 = this->WalkId;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->DirectoryVisited,(ulong)i);
    *pvVar3 = vVar1;
    j._M_current = (pair<int,_int> *)
                   std::
                   vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                   ::operator[](&this->ConflictGraph,(ulong)i);
    local_28._M_current =
         (pair<int,_int> *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                   ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                    j._M_current);
    while( true ) {
      local_30._M_current =
           (pair<int,_int> *)
           std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                     (j._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
      if (!bVar2) break;
      ppVar4 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator->(&local_28);
      VisitDirectory(this,ppVar4->first);
      __gnu_cxx::
      __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&local_28);
    }
    __x = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&this->OriginalDirectories,(ulong)i);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->OrderedDirectories,__x);
  }
  else {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->DirectoryVisited,(ulong)i);
    if (*pvVar3 == this->WalkId) {
      DiagnoseCycle(this);
    }
  }
  return;
}

Assistant:

void cmOrderDirectories::VisitDirectory(unsigned int i)
{
  // Skip nodes already visited.
  if (this->DirectoryVisited[i]) {
    if (this->DirectoryVisited[i] == this->WalkId) {
      // We have reached a node previously visited on this DFS.
      // There is a cycle.
      this->DiagnoseCycle();
    }
    return;
  }

  // We are now visiting this node so mark it.
  this->DirectoryVisited[i] = this->WalkId;

  // Visit the neighbors of the node first.
  ConflictList const& clist = this->ConflictGraph[i];
  for (ConflictList::const_iterator j = clist.begin(); j != clist.end(); ++j) {
    this->VisitDirectory(j->first);
  }

  // Now that all directories required to come before this one have
  // been emmitted, emit this directory.
  this->OrderedDirectories.push_back(this->OriginalDirectories[i]);
}